

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O1

DecodeStatus DecodeMSRSystemRegister(MCInst *Inst,uint Imm,uint64_t Address,void *Decoder)

{
  _Bool ValidNamed;
  char result [128];
  _Bool local_99;
  char local_98 [136];
  
  MCOperand_CreateImm0(Inst,(ulong)(Imm | 0x8000));
  A64SysRegMapper_toString(&AArch64_MSRMapper,Imm | 0x8000,&local_99,local_98);
  return (uint)local_99 + (uint)local_99 * 2;
}

Assistant:

static DecodeStatus DecodeMSRSystemRegister(MCInst *Inst, unsigned Imm,
		uint64_t Address,
		void *Decoder)
{
	bool ValidNamed;
	char result[128];

	Imm |= 0x8000;
	MCOperand_CreateImm0(Inst, Imm);

	A64SysRegMapper_toString(&AArch64_MSRMapper, Imm, &ValidNamed, result);

	return ValidNamed ? Success : Fail;
}